

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O2

void re2::AppendCCChar(string *t,Rune r)

{
  void *pvVar1;
  string sStack_38;
  
  if (0x5e < r - 0x20U) {
    switch(r) {
    case 9:
      break;
    case 10:
      break;
    default:
      if (r < 0x100) {
        StringPrintf_abi_cxx11_(&sStack_38,"\\x%02x",(ulong)(uint)r);
        std::__cxx11::string::append((string *)t);
      }
      else {
        StringPrintf_abi_cxx11_(&sStack_38,"\\x{%x}",(ulong)(uint)r);
        std::__cxx11::string::append((string *)t);
      }
      std::__cxx11::string::~string((string *)&sStack_38);
      return;
    case 0xc:
      break;
    case 0xd:
    }
    std::__cxx11::string::append((char *)t);
    return;
  }
  pvVar1 = memchr("[]^-\\",r,6);
  if (pvVar1 != (void *)0x0) {
    std::__cxx11::string::append((char *)t);
  }
  std::__cxx11::string::append((ulong)t,'\x01');
  return;
}

Assistant:

static void AppendCCChar(std::string* t, Rune r) {
  if (0x20 <= r && r <= 0x7E) {
    if (strchr("[]^-\\", r))
      t->append("\\");
    t->append(1, static_cast<char>(r));
    return;
  }
  switch (r) {
    default:
      break;

    case '\r':
      t->append("\\r");
      return;

    case '\t':
      t->append("\\t");
      return;

    case '\n':
      t->append("\\n");
      return;

    case '\f':
      t->append("\\f");
      return;
  }

  if (r < 0x100) {
    *t += StringPrintf("\\x%02x", static_cast<int>(r));
    return;
  }
  *t += StringPrintf("\\x{%x}", static_cast<int>(r));
}